

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::IPCFrame_BindServiceReply::IPCFrame_BindServiceReply
          (IPCFrame_BindServiceReply *this)

{
  IPCFrame_BindServiceReply *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__IPCFrame_BindServiceReply_009c3830;
  this->success_ = false;
  this->service_id_ = 0;
  std::
  vector<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo,_std::allocator<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo>_>
  ::vector(&this->methods_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<4UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

IPCFrame_BindServiceReply::IPCFrame_BindServiceReply() = default;